

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O2

void character_behaviour_set_input(tgestate_t *state,vischar_t *vischar,uint8_t new_input)

{
  if (vischar->input != new_input) {
    vischar->input = new_input | 0x80;
  }
  return;
}

Assistant:

void character_behaviour_set_input(tgestate_t *state,
                                   vischar_t  *vischar,
                                   uint8_t     new_input)
{
  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  // assert(new_input);

  if (new_input != vischar->input)
    vischar->input = new_input | input_KICK;
  assert((vischar->input & ~input_KICK) < 9);
}